

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::update(Forth *this)

{
  iterator iVar1;
  Cell u;
  Cell local_c;
  
  local_c = this->blockCurrent;
  if (local_c != 0) {
    iVar1 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>,_std::_Select1st<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
            ::find(&(this->blocksInProcess)._M_t,&local_c);
    if ((_Rb_tree_header *)iVar1._M_node !=
        &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header) {
      *(undefined1 *)((long)&iVar1._M_node[1]._M_parent + 4) = 1;
    }
  }
  return;
}

Assistant:

void update(){
			Cell u = blockCurrent;
			if (u > 0) {
				auto foundIt = blocksInProcess.find(u);
				if (foundIt != blocksInProcess.end()) {
					(*foundIt).second.blockModified = true;
				}
			}
		}